

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factor.h
# Opt level: O0

factor * __thiscall merlin::factor::binaryOpIP<merlin::factor::binOpPlus>(factor *this,vsize *B)

{
  vsize *this_00;
  bool bVar1;
  size_t sVar2;
  reference a;
  value b;
  ulong local_118;
  size_t i;
  subindex s2;
  factor local_c8;
  undefined1 local_58 [8];
  variable_set v;
  factor *B_local;
  factor *this_local;
  
  v.m_d = B;
  variable_set::operator+((variable_set *)local_58,&this->v_,(variable_set *)(B + 1));
  bVar1 = variable_set::operator!=((variable_set *)local_58,&this->v_);
  if (bVar1) {
    binaryOp<merlin::factor::binOpPlus>(&local_c8,this,v.m_d);
    operator=(this,&local_c8);
    ~factor(&local_c8);
  }
  else {
    subindex::subindex((subindex *)&i,&this->v_,(variable_set *)(v.m_d + 1));
    local_118 = 0;
    while( true ) {
      sVar2 = num_states(this);
      if (sVar2 <= local_118) break;
      a = std::vector<double,_std::allocator<double>_>::operator[](&this->t_,local_118);
      this_00 = v.m_d;
      sVar2 = subindex::operator_cast_to_unsigned_long((subindex *)&i);
      b = operator[]((factor *)this_00,sVar2);
      binOpPlus::IP((binOpPlus *)((long)&this_local + 7),a,b);
      local_118 = local_118 + 1;
      subindex::operator++((subindex *)&i);
    }
    subindex::~subindex((subindex *)&i);
  }
  variable_set::~variable_set((variable_set *)local_58);
  return this;
}

Assistant:

factor& binaryOpIP(const factor& B,
			Function Op) {
		variable_set v = v_ + B.v_;  							// expand scope to union
		if (v != v_)
			*this = binaryOp(B, Op); // if A's scope is too small, call binary op
		else {
			subindex s2(v_, B.v_);       		// otherwise create index over B
			for (size_t i = 0; i < num_states(); ++i, ++s2)
				Op.IP(t_[i], B[s2]);	// and do the operations
		}
		return *this;
	}